

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_permute_cols(m256v *M,int *colperm)

{
  int n_row;
  uint8_t *memory;
  uint8_t auStack_70 [8];
  long local_68;
  int local_5c;
  int local_58;
  int e_next;
  int e;
  int i_1;
  m256v colbuf_mat;
  unsigned_long __vla_expr1;
  int i;
  unsigned_long __vla_expr0;
  int *colperm_local;
  m256v *M_local;
  
  local_68 = (long)&local_68 - ((ulong)(uint)M->n_col + 0xf & 0xfffffffffffffff0);
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < M->n_col;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    *(undefined1 *)(local_68 + __vla_expr1._4_4_) = 0;
  }
  colbuf_mat.e = (uint8_t *)(ulong)(uint)M->n_row;
  memory = (uint8_t *)(local_68 - ((ulong)(colbuf_mat.e + 0xf) & 0xfffffffffffffff0));
  n_row = M->n_row;
  builtin_memcpy(memory + -8,"\x067\x10",4);
  memory[-4] = '\0';
  memory[-3] = '\0';
  memory[-2] = '\0';
  memory[-1] = '\0';
  m256v_make((m256v *)&e,n_row,1,memory);
  for (e_next = 0; e_next < M->n_col; e_next = e_next + 1) {
    if (*(char *)(local_68 + e_next) == '\0') {
      if (colperm[e_next] == e_next) {
        *(undefined1 *)(local_68 + e_next) = 1;
      }
      else {
        builtin_memcpy(memory + -8,"c7\x10",4);
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_copy_col(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),*(m256v **)(memory + 0x18)
                       ,*(int *)(memory + 0x14));
        local_58 = e_next;
        for (local_5c = colperm[e_next]; local_5c != e_next; local_5c = colperm[local_5c]) {
          *(undefined1 *)(local_68 + local_5c) = 1;
          memory[-8] = 0x9e;
          memory[-7] = '7';
          memory[-6] = '\x10';
          memory[-5] = '\0';
          memory[-4] = '\0';
          memory[-3] = '\0';
          memory[-2] = '\0';
          memory[-1] = '\0';
          m256v_copy_col(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),
                         *(m256v **)(memory + 0x18),*(int *)(memory + 0x14));
          local_58 = local_5c;
        }
        *(undefined1 *)(local_68 + e_next) = 1;
        memory[-8] = 0xd2;
        memory[-7] = '7';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_copy_col(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),*(m256v **)(memory + 0x18)
                       ,*(int *)(memory + 0x14));
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}